

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O1

void __thiscall JUnitTestOutput::printFailure(JUnitTestOutput *this,TestFailure *failure)

{
  size_t *psVar1;
  TestFailure *this_00;
  
  if (((this->impl_->results_).tail_)->failure_ == (TestFailure *)0x0) {
    psVar1 = &(this->impl_->results_).failureCount_;
    *psVar1 = *psVar1 + 1;
    this_00 = (TestFailure *)
              operator_new(0x68,
                           "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/JUnitTestOutput.cpp"
                           ,0x133);
    TestFailure::TestFailure(this_00,failure);
    ((this->impl_->results_).tail_)->failure_ = this_00;
  }
  return;
}

Assistant:

void JUnitTestOutput::printFailure(const TestFailure& failure)
{
    if (impl_->results_.tail_->failure_ == NULLPTR) {
        impl_->results_.failureCount_++;
        impl_->results_.tail_->failure_ = new TestFailure(failure);
    }
}